

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cc
# Opt level: O1

int __thiscall
iqnet::Acceptor::accept(Acceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  char cVar1;
  int extraout_EAX;
  Firewall_base *pFVar2;
  string msg;
  Socket new_sock;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  Socket local_30;
  
  Socket::accept(&local_30,(int)this + 8,__addr,__addr_len);
  pFVar2 = this->firewall;
  if (pFVar2 != (Firewall_base *)0x0) {
    cVar1 = (**(code **)(*(long *)pFVar2 + 0x10))(pFVar2,&local_30.peer);
    if (cVar1 == '\0') {
      pFVar2 = this->firewall;
      (**(code **)(*(long *)pFVar2 + 0x18))(&local_50);
      if (local_48 == 0) {
        Socket::shutdown(&local_30,(int)pFVar2,0);
      }
      else {
        Socket::send_shutdown(&local_30,(char *)local_50,local_48);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      goto LAB_00146642;
    }
  }
  (*this->factory->_vptr_Accepted_conn_factory[2])(this->factory,&local_30);
LAB_00146642:
  local_30._vptr_Socket = (_func_int **)&PTR__Socket_0018b6d8;
  local_30.peer._vptr_Inet_addr = (_func_int **)&PTR__Inet_addr_00188ef8;
  boost::detail::shared_count::~shared_count(&local_30.peer.impl_.pn);
  return extraout_EAX;
}

Assistant:

void Acceptor::accept()
{
  Socket new_sock( sock.accept() );

  if( firewall && !firewall->grant( new_sock.get_peer_addr() ) )
  {
    std::string msg = firewall->message();

    if (!msg.empty())
    {
      new_sock.send_shutdown(msg.c_str(), msg.size());
    } else {
      new_sock.shutdown();
    }

    return;
  }

  factory->create_accepted( new_sock );
}